

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O1

Abc_Obj_t * Ver_ParseCreateLatch(Abc_Ntk_t *pNtk,Abc_Obj_t *pNetLI,Abc_Obj_t *pNetLO)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pObj;
  char *pName;
  
  pAVar1 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BI);
  Abc_ObjAddFanin(pAVar1,pNetLI);
  pObj = Abc_NtkCreateObj(pNtk,ABC_OBJ_LATCH);
  Abc_ObjAddFanin(pObj,pAVar1);
  pAVar1 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BO);
  Abc_ObjAddFanin(pAVar1,pObj);
  Abc_ObjAddFanin(pNetLO,pAVar1);
  pName = Abc_ObjName(pNetLO);
  Abc_ObjAssignName(pObj,pName,"L");
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 8) {
    pObj->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x3;
    return pObj;
  }
  __assert_fail("Abc_ObjIsLatch(pLatch)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x1a5,"void Abc_LatchSetInitDc(Abc_Obj_t *)");
}

Assistant:

Abc_Obj_t * Ver_ParseCreateLatch( Abc_Ntk_t * pNtk, Abc_Obj_t * pNetLI, Abc_Obj_t * pNetLO )
{
    Abc_Obj_t * pLatch, * pTerm;
    // add the BO terminal
    pTerm = Abc_NtkCreateBi( pNtk );
    Abc_ObjAddFanin( pTerm, pNetLI );
    // add the latch box
    pLatch = Abc_NtkCreateLatch( pNtk );
    Abc_ObjAddFanin( pLatch, pTerm  );
    // add the BI terminal
    pTerm = Abc_NtkCreateBo( pNtk );
    Abc_ObjAddFanin( pTerm, pLatch );
    // get the LO net
    Abc_ObjAddFanin( pNetLO, pTerm );
    // set latch name
    Abc_ObjAssignName( pLatch, Abc_ObjName(pNetLO), "L" );
    Abc_LatchSetInitDc( pLatch );
    return pLatch;
}